

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QModelIndex * __thiscall
QAbstractItemView::currentIndex(QModelIndex *__return_storage_ptr__,QAbstractItemView *this)

{
  long lVar1;
  
  lVar1 = *(long *)(*(long *)(this + 8) + 800);
  if (((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) || (*(long *)(*(long *)(this + 8) + 0x328) == 0))
  {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QItemSelectionModel::currentIndex();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QAbstractItemView::currentIndex() const
{
    Q_D(const QAbstractItemView);
    return d->selectionModel ? d->selectionModel->currentIndex() : QModelIndex();
}